

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::LifetimeTests::details::FboOutputAttacher::drawAttachment
          (FboOutputAttacher *this,GLuint element,Surface *dst)

{
  Context *ctx;
  Attacher *pAVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  ObjectTraits *traits;
  char *__s;
  size_t sVar3;
  undefined4 extraout_var_01;
  Framebuffer fbo;
  ObjectWrapper local_1c0;
  undefined1 local_1a8 [8];
  _func_int **local_1a0;
  ios_base local_130 [264];
  undefined4 extraout_var_00;
  
  iVar2 = (*((this->super_OutputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
            _vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_1c0,(Functions *)CONCAT44(extraout_var,iVar2),traits);
  pAVar1 = (this->super_OutputAttacher).m_attacher;
  (pAVar1->super_ContextWrapper).super_CallLogWrapper.m_enableLog = false;
  (*pAVar1->_vptr_Attacher[1])(pAVar1,element,(ulong)local_1c0.m_object);
  ctx = &(this->super_OutputAttacher).super_ContextWrapper.m_ctx;
  drawFbo(ctx,local_1c0.m_object,dst);
  pAVar1 = (this->super_OutputAttacher).m_attacher;
  (*pAVar1->_vptr_Attacher[2])(pAVar1,element,(ulong)local_1c0.m_object);
  (((this->super_OutputAttacher).m_attacher)->super_ContextWrapper).super_CallLogWrapper.m_enableLog
       = true;
  local_1a8 = (undefined1  [8])
              ((this->super_OutputAttacher).super_ContextWrapper.m_ctx.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"// Read pixels from ",0x14);
  iVar2 = (*((this->super_OutputAttacher).m_attacher)->m_elementType->_vptr_Type[7])();
  __s = (char *)CONCAT44(extraout_var_00,iVar2);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_1a0 + (int)local_1a0[-3]);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0," ",1);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0," to output image.",0x11)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  iVar2 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  err = (**(code **)(CONCAT44(extraout_var_01,iVar2) + 0x800))();
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0x145);
  glu::ObjectWrapper::~ObjectWrapper(&local_1c0);
  return;
}

Assistant:

void FboOutputAttacher::drawAttachment (GLuint element, Surface& dst)
{
	Framebuffer fbo(getRenderContext());
	m_attacher.enableLogging(false);
	m_attacher.attach(element, *fbo);
	drawFbo(getContext(), *fbo, dst);
	m_attacher.detach(element, *fbo);
	m_attacher.enableLogging(true);
	log() << TestLog::Message
		  << "// Read pixels from " << m_attacher.getElementType().getName() << " " << element
		  << " to output image."
		  << TestLog::EndMessage;
	GLU_CHECK_ERROR(gl().getError());
}